

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O0

int ffgpxf(fitsfile *fptr,int datatype,long *firstpix,LONGLONG nelem,void *array,char *nullarray,
          int *anynul,int *status)

{
  int local_360;
  int local_35c;
  int ii;
  int naxis;
  LONGLONG tfirstpix [99];
  char *nullarray_local;
  void *array_local;
  LONGLONG nelem_local;
  long *firstpix_local;
  int datatype_local;
  fitsfile *fptr_local;
  
  if ((*status < 1) && (nelem != 0)) {
    tfirstpix[0x62] = (LONGLONG)nullarray;
    ffgidm(fptr,&local_35c,status);
    for (local_360 = 0; local_360 < local_35c; local_360 = local_360 + 1) {
      *(long *)(&ii + (long)local_360 * 2) = firstpix[local_360];
    }
    ffgpxfll(fptr,datatype,(LONGLONG *)&ii,nelem,array,(char *)tfirstpix[0x62],anynul,status);
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgpxf( fitsfile *fptr,   /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            long *firstpix,   /* I - coord of first pixel to read (1s based) */
            LONGLONG nelem,       /* I - number of values to read            */
            void *array,      /* O - array of values that are returned       */
            char *nullarray,  /* O - returned array of null value flags      */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  The nullarray values will = 1 if the corresponding array value is null.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    LONGLONG tfirstpix[99];
    int naxis, ii;

    if (*status > 0 || nelem == 0)   /* inherit input status value if > 0 */
        return(*status);

    /* get the size of the image */
    ffgidm(fptr, &naxis, status);

    for (ii=0; ii < naxis; ii++)
       tfirstpix[ii] = firstpix[ii];

    ffgpxfll(fptr, datatype, tfirstpix, nelem, array, nullarray, anynul, status);

    return(*status);
}